

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

image_u8 * __thiscall
crnlib::mip_level::get_unpacked_image(mip_level *this,image_u8 *tmp,uint unpack_flags)

{
  bool bVar1;
  uint in_EDX;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RSI;
  image_u8 *in_RDI;
  image_u8 *in_stack_000000a0;
  dxt_image *in_stack_000000a8;
  undefined4 in_stack_ffffffffffffffe0;
  image_u8 *other;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_fffffffffffffff8;
  
  other = in_RDI;
  bVar1 = is_valid((mip_level *)in_RDI);
  if (bVar1) {
    if ((dxt_image *)in_RDI->m_pPixels == (dxt_image *)0x0) {
      if (((in_EDX & 2) == 0) || (((ulong)(in_RDI->m_pixel_buf).m_p & 3) == 0)) {
        return *(image_u8 **)&in_RDI->m_comp_flags;
      }
      image<crnlib::color_quad<unsigned_char,_int>_>::operator=(in_stack_fffffffffffffff8,other);
    }
    else {
      dxt_image::unpack(in_stack_000000a8,in_stack_000000a0);
      image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags(in_RSI,in_RDI->m_pitch);
      if ((in_EDX & 1) != 0) {
        uncook_image((mip_level *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RDI);
      }
    }
    if ((in_EDX & 2) != 0) {
      if (((ulong)(in_RDI->m_pixel_buf).m_p & 1) != 0) {
        image<crnlib::color_quad<unsigned_char,_int>_>::flip_x(other);
      }
      if (((ulong)(in_RDI->m_pixel_buf).m_p & 2) != 0) {
        image<crnlib::color_quad<unsigned_char,_int>_>::flip_y(other);
      }
    }
  }
  else {
    in_RSI = (image_u8 *)0x0;
  }
  return in_RSI;
}

Assistant:

image_u8* mip_level::get_unpacked_image(image_u8& tmp, uint unpack_flags) const {
  if (!is_valid())
    return NULL;

  if (m_pDXTImage) {
    m_pDXTImage->unpack(tmp);

    tmp.set_comp_flags(m_comp_flags);

    if (unpack_flags & cUnpackFlagUncook)
      uncook_image(tmp);
  } else if ((unpack_flags & cUnpackFlagUnflip) && (m_orient_flags & (cOrientationFlagXFlipped | cOrientationFlagYFlipped)))
    tmp = *m_pImage;
  else
    return m_pImage;

  if (unpack_flags & cUnpackFlagUnflip) {
    if (m_orient_flags & cOrientationFlagXFlipped)
      tmp.flip_x();
    if (m_orient_flags & cOrientationFlagYFlipped)
      tmp.flip_y();
  }

  return &tmp;
}